

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O3

FunctionBody * __thiscall
ByteCodeGenerator::EnsureFakeGlobalFuncForUndefer(ByteCodeGenerator *this,ParseNode *pnode)

{
  undefined1 *puVar1;
  Type *addr;
  JavascriptLibrary *pJVar2;
  FunctionBody *pFVar3;
  ParseNodeFnc *pPVar4;
  
  pFVar3 = (((this->scriptContext->super_ScriptContextBase).javascriptLibrary)->
           fakeGlobalFuncForUndefer).ptr;
  if (pFVar3 == (FunctionBody *)0x0) {
    pFVar3 = MakeGlobalFunctionBody(this,pnode);
    pJVar2 = (this->scriptContext->super_ScriptContextBase).javascriptLibrary;
    addr = &pJVar2->fakeGlobalFuncForUndefer;
    Memory::Recycler::WBSetBit((char *)addr);
    (pJVar2->fakeGlobalFuncForUndefer).ptr = pFVar3;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
  }
  pPVar4 = ParseNode::AsParseNodeFnc(pnode);
  if ((pPVar4->fncFlags & kFunctionStrictMode) != kFunctionNone) {
    puVar1 = &(pFVar3->super_ParseableFunctionInfo).super_FunctionProxy.field_0x46;
    *puVar1 = *puVar1 | 1;
  }
  return pFVar3;
}

Assistant:

Js::FunctionBody *ByteCodeGenerator::EnsureFakeGlobalFuncForUndefer(ParseNode *pnode)
{
    Js::FunctionBody *func = scriptContext->GetLibrary()->GetFakeGlobalFuncForUndefer();
    if (!func)
    {
        func = this->MakeGlobalFunctionBody(pnode);
        scriptContext->GetLibrary()->SetFakeGlobalFuncForUndefer(func);
    }
    if (pnode->AsParseNodeFnc()->GetStrictMode() != 0)
    {
        func->SetIsStrictMode();
    }

    return func;
}